

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SignLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sign(NeuralNetworkLayer *this)

{
  bool bVar1;
  SignLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_sign(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_sign(this);
    this_00 = (SignLayerParams *)operator_new(0x18);
    SignLayerParams::SignLayerParams(this_00);
    (this->layer_).sign_ = this_00;
  }
  return (SignLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SignLayerParams* NeuralNetworkLayer::mutable_sign() {
  if (!has_sign()) {
    clear_layer();
    set_has_sign();
    layer_.sign_ = new ::CoreML::Specification::SignLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sign)
  return layer_.sign_;
}